

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O2

void __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::clear
          (tsqueue<blcl::net::owned_message<MsgType>_> *this)

{
  std::mutex::lock(&this->queue_mtx_);
  std::deque<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ::clear(&this->raw_deque_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mtx_);
  return;
}

Assistant:

void clear() {
            std::scoped_lock lock(queue_mtx_);
            raw_deque_.clear();
        }